

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaOf.c
# Opt level: O3

int Of_ManComputeForwardDirconObj(Of_Man_t *p,int iObj)

{
  uint *puVar1;
  uint uVar2;
  Of_Obj_t *pOVar3;
  int *piVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  uint *puVar9;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  uint *pCut;
  uint *puVar13;
  int Delay2This;
  int Delay1This;
  int local_48;
  int local_44;
  ulong local_40;
  uint *local_38;
  
  uVar10 = (ulong)(uint)iObj;
  if ((-1 < iObj) && (iVar6 = (p->vCutSets).nSize, iObj < iVar6)) {
    uVar11 = (ulong)(uint)iObj;
    uVar2 = (p->vCutSets).pArray[uVar11];
    uVar7 = (int)uVar2 >> 0x10;
    if (((int)uVar7 < 0) || ((p->vPages).nSize <= (int)uVar7)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    puVar1 = (uint *)((long)(p->vPages).pArray[uVar7] + (ulong)(uVar2 & 0xffff) * 4);
    iVar12 = 0;
    if ((int)*puVar1 < 1) {
      iVar8 = 1000000000;
      puVar9 = (uint *)0x0;
      puVar13 = (uint *)0x0;
      iVar5 = 1000000000;
    }
    else {
      pCut = puVar1 + 1;
      iVar5 = 1000000000;
      puVar13 = (uint *)0x0;
      puVar9 = (uint *)0x0;
      iVar8 = 1000000000;
      local_40 = uVar11;
      do {
        local_38 = puVar9;
        Of_ManComputeForwardDirconCut(p,(int)uVar10,(int *)pCut,&local_44,&local_48);
        puVar9 = local_38;
        if (local_44 < iVar5) {
          puVar9 = pCut;
        }
        iVar6 = local_44;
        if (iVar5 < local_44) {
          iVar6 = iVar5;
        }
        iVar5 = iVar6;
        if (local_48 < iVar8) {
          puVar13 = pCut;
        }
        iVar6 = local_48;
        if (iVar8 < local_48) {
          iVar6 = iVar8;
        }
        iVar8 = iVar6;
        iVar12 = iVar12 + 1;
        pCut = pCut + (ulong)(*pCut & 0x1f) + 4;
      } while (iVar12 < (int)*puVar1);
      iVar6 = (p->vCutSets).nSize;
      uVar11 = local_40;
    }
    pOVar3 = p->pObjs;
    pOVar3[uVar11].Delay1 = iVar5;
    pOVar3[uVar11].Delay2 = iVar8;
    if (iObj < iVar6) {
      if (puVar1 <= puVar9 && (long)puVar9 - (long)puVar1 != 0) {
        piVar4 = (p->vCutSets).pArray;
        pOVar3[uVar11].iCutH = (int)((ulong)((long)puVar9 - (long)puVar1) >> 2) + piVar4[uVar11];
        if (puVar1 <= puVar13 && (long)puVar13 - (long)puVar1 != 0) {
          pOVar3[uVar11].iCutH2 = (int)((ulong)((long)puVar13 - (long)puVar1) >> 2) + piVar4[uVar11]
          ;
          return iVar5;
        }
      }
      __assert_fail("pCut > pCutSet",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaOf.c"
                    ,0x6c,"int Of_CutHandle(int *, int *)");
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

int Of_ManComputeForwardDirconObj( Of_Man_t * p, int iObj )
{
    int Delay1 = ABC_INFINITY, Delay2 = ABC_INFINITY;
    int i, * pCut, * pCutMin = NULL, * pCutMin2 = NULL, * pList = Of_ObjCutSet(p, iObj);
    Of_SetForEachCut( pList, pCut, i )
    {
        int Delay1This, Delay2This;
        Of_ManComputeForwardDirconCut( p, iObj, pCut, &Delay1This, &Delay2This );
        if ( Delay1 > Delay1This )
            pCutMin = pCut;
        if ( Delay2 > Delay2This )
            pCutMin2 = pCut;
        Delay1 = Abc_MinInt( Delay1, Delay1This );
        Delay2 = Abc_MinInt( Delay2, Delay2This );
    }
    Of_ObjSetDelay1( p, iObj, Delay1 );
    Of_ObjSetDelay2( p, iObj, Delay2 );
    Of_ObjSetCutBestP( p, pList, iObj, pCutMin );
    Of_ObjSetCutBestP2( p, pList, iObj, pCutMin2 );
    return Delay1;
}